

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeGuard.cc
# Opt level: O1

void dismiss_test(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ostream *poVar3;
  undefined8 uVar4;
  bool flag;
  ScopeGuard s;
  char local_61;
  _Any_data local_60;
  _Manager_type local_50 [2];
  undefined1 local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._M_unused._M_object = &local_61;
  local_61 = '\x01';
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc:44:22)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc:44:22)>
             ::_M_manager;
  std::function<void_()>::function((function<void_()> *)&local_60,(function<void_()> *)&local_38);
  local_40 = 0;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_40 = 1;
  ScopeGuard::~ScopeGuard((ScopeGuard *)&local_60);
  pUVar2 = UnitTest::getInstance();
  iVar1 = (*pUVar2->current_case_->_vptr_BaseCase[2])();
  if ((char)iVar1 == '\0') {
    pUVar2 = UnitTest::getInstance();
    local_60._M_unused._M_object = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
               ,"");
    std::__cxx11::string::_M_assign((string *)&pUVar2->last_checked_file_);
    if ((_Manager_type *)local_60._M_unused._0_8_ != local_50) {
      operator_delete(local_60._M_unused._M_object,(ulong)(local_50[0] + 1));
    }
    pUVar2 = UnitTest::getInstance();
    pUVar2->last_checked_line_ = 0x2f;
    if (local_61 == '\0') {
      pUVar2 = UnitTest::getInstance();
      pUVar2->failure_num_ = pUVar2->failure_num_ + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>> check \"",0xb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"flag",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" failed.",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"at ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/ScopeGuard.cc"
                 ,0x55);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&AbortThisCase::typeinfo,0);
}

Assistant:

TEST_CASE(dismiss_test)
{
    bool flag = true;
    {
        ScopeGuard s{[&]{ flag = false; }};
        s.dismiss();
    }
    TEST_CHECK(flag);
}